

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_deflate.cpp
# Opt level: O0

void __thiscall ktx::CommandDeflate::executeDeflate(CommandDeflate *this)

{
  string_view filepath;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  bool bVar1;
  ktxStream *pkVar2;
  ktxTexture2 **ppkVar3;
  ktxTexture2 *pkVar4;
  uint *puVar5;
  ulong uVar6;
  size_type sVar7;
  char *pcVar8;
  size_t sVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  path *this_00;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  long in_RDI;
  OutputStream outputFile;
  path outputPath;
  string newScParams;
  string writer_1;
  uint32_t i;
  smatch deflateOptionMatch;
  regex e;
  string writer;
  string origWriterName;
  string writerScParams;
  bool changeWriter;
  anon_class_8_1_2ed807fb updateMetadataValue;
  anon_class_8_1_2ed807fb *findMetadataValue;
  ktx_error_code_e ret;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  KTXTexture2 texture;
  InputStream inputStream;
  string *in_stack_fffffffffffff4a8;
  InputStream *in_stack_fffffffffffff4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4b8;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *in_stack_fffffffffffff4c0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffff4c8;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *in_stack_fffffffffffff4d0;
  format fVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4d8;
  char *in_stack_fffffffffffff4e0;
  flag_type __f;
  anon_class_8_1_2ed807fb *in_stack_fffffffffffff4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char (*in_stack_fffffffffffff500) [46];
  Reporter *in_stack_fffffffffffff508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff510;
  size_t *psVar12;
  char (*in_stack_fffffffffffff518) [60];
  undefined8 in_stack_fffffffffffff520;
  ReturnCode return_code;
  Reporter *in_stack_fffffffffffff528;
  Reporter *in_stack_fffffffffffff540;
  undefined6 in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff54e;
  undefined1 in_stack_fffffffffffff54f;
  Reporter *in_stack_fffffffffffff550;
  ktxTexture *in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff560;
  int in_stack_fffffffffffff564;
  undefined8 in_stack_fffffffffffff570;
  ktxSupercmpScheme scheme;
  undefined4 in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff584;
  string *in_stack_fffffffffffff588;
  InputStream *in_stack_fffffffffffff590;
  string *in_stack_fffffffffffff598;
  istream *in_stack_fffffffffffff5a0;
  path local_9b0;
  string local_988 [32];
  string local_968 [72];
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_910;
  char *local_908;
  _func_int **local_900;
  string local_8f8 [16];
  format_args in_stack_fffffffffffff718;
  char *in_stack_fffffffffffff728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  size_t in_stack_fffffffffffff730;
  undefined8 local_8c8;
  char *local_8c0;
  undefined1 local_8b8 [8];
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> local_8b0;
  char *local_870;
  size_t local_868;
  string local_860 [36];
  uint local_83c;
  string local_838 [96];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  undefined1 local_778 [48];
  KTXTexture2 *local_748;
  KTXTexture2 **local_740;
  ktxTexture *local_738;
  undefined8 local_730;
  string local_728 [32];
  string local_708 [44];
  int local_6dc;
  KTXTexture2 local_6b0;
  undefined1 local_6a8 [16];
  string local_698 [48];
  InputStream local_668;
  undefined1 local_2a8 [40];
  undefined8 local_280;
  undefined1 *local_278;
  char *local_270;
  bool *local_260;
  long local_258;
  char *local_250;
  size_t sStack_248;
  string *local_240;
  char *local_238;
  char **local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228 [2];
  undefined8 local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_210;
  char *local_208;
  long local_1f8;
  char *local_1f0;
  undefined1 auStack_1e8 [24];
  char **local_1d0;
  undefined1 local_1c8 [56];
  undefined8 local_190;
  undefined1 *local_188;
  char *local_180;
  undefined1 *local_170;
  string *local_168;
  undefined1 *local_160;
  char *local_158;
  _func_int **pp_Stack_150;
  string *local_148;
  char *local_140;
  char **local_138;
  char *local_130;
  char **local_128;
  char *local_120;
  char **local_118;
  char *local_110;
  char **local_108;
  char **local_100;
  char *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_e0;
  undefined8 *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_c8;
  undefined8 local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0;
  undefined8 *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined8 *local_90;
  undefined1 *local_88;
  char **local_80;
  char *local_78;
  char *local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  char *local_8;
  
  return_code = (ReturnCode)((ulong)in_stack_fffffffffffff520 >> 0x20);
  scheme = (ktxSupercmpScheme)((ulong)in_stack_fffffffffffff570 >> 0x20);
  InputStream::InputStream
            (in_stack_fffffffffffff590,in_stack_fffffffffffff588,
             (Reporter *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580));
  InputStream::operator_cast_to_istream_(&local_668);
  local_6a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x80));
  filepath._M_str = (char *)in_stack_fffffffffffff508;
  filepath._M_len = (size_t)in_stack_fffffffffffff500;
  fmtInFile_abi_cxx11_(filepath);
  validateToolInput(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                    (Reporter *)in_stack_fffffffffffff590);
  std::__cxx11::string::~string(local_698);
  KTXTexture2::KTXTexture2(&local_6b0,(nullptr_t)0x0);
  InputStream::operator->(&local_668);
  std::ios::rdbuf();
  std::operator|(_S_in,_S_bin);
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::StreambufStream
            (in_stack_fffffffffffff4d0,
             (basic_streambuf<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4c8,
             (openmode)((ulong)in_stack_fffffffffffff4c0 >> 0x20));
  pkVar2 = StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::stream
                     ((StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)
                      0x256974);
  ppkVar3 = KTXTexture2::pHandle(&local_6b0);
  local_6dc = ktxTexture2_CreateFromStream(pkVar2,1,ppkVar3);
  if (local_6dc != 0) {
    local_708._32_8_ = ktxErrorString(local_6dc);
    Reporter::fatal<char_const(&)[34],char_const*>
              (in_stack_fffffffffffff528,return_code,(char (*) [34])in_stack_fffffffffffff518,
               (char **)in_stack_fffffffffffff510);
  }
  pkVar4 = KTXTexture2::operator->(&local_6b0);
  if (pkVar4->supercompressionScheme != KTX_SS_BEGIN_RANGE) {
    pkVar4 = KTXTexture2::operator->(&local_6b0);
    if (pkVar4->supercompressionScheme == KTX_SS_ZSTD ||
        pkVar4->supercompressionScheme == KTX_SS_END_RANGE) {
      if ((*(byte *)(in_RDI + 0x48) & 1) == 0) {
        KTXTexture2::operator->(&local_6b0);
        toString_abi_cxx11_(scheme);
        Reporter::warning<char_const(&)[46],std::__cxx11::string,std::__cxx11::string&>
                  (in_stack_fffffffffffff508,in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                   in_stack_fffffffffffff4f0);
        std::__cxx11::string::~string(local_708);
      }
    }
    else {
      KTXTexture2::operator->(&local_6b0);
      toString_abi_cxx11_(scheme);
      Reporter::fatal<char_const(&)[60],std::__cxx11::string>
                (in_stack_fffffffffffff528,return_code,in_stack_fffffffffffff518,
                 in_stack_fffffffffffff510);
      std::__cxx11::string::~string(local_728);
    }
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x256c83);
  if (bVar1) {
    pkVar4 = KTXTexture2::operator_cast_to_ktxTexture2_(&local_6b0);
    puVar5 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x256cb4);
    local_6dc = ktxTexture2_DeflateZstd(pkVar4,*puVar5);
    if (local_6dc != 0) {
      local_730 = ktxErrorString(local_6dc);
      Reporter::fatal<char_const(&)[37],char_const*>
                (in_stack_fffffffffffff528,return_code,(char (*) [37])in_stack_fffffffffffff518,
                 (char **)in_stack_fffffffffffff510);
    }
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x256d5e);
  if (bVar1) {
    pkVar4 = KTXTexture2::operator_cast_to_ktxTexture2_(&local_6b0);
    puVar5 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x256d8f);
    in_stack_fffffffffffff564 = ktxTexture2_DeflateZLIB(pkVar4,*puVar5);
    local_6dc = in_stack_fffffffffffff564;
    if (in_stack_fffffffffffff564 != 0) {
      in_stack_fffffffffffff550 = (Reporter *)(in_RDI + 8);
      in_stack_fffffffffffff558 = (ktxTexture *)ktxErrorString(in_stack_fffffffffffff564);
      local_738 = in_stack_fffffffffffff558;
      Reporter::fatal<char_const(&)[37],char_const*>
                (in_stack_fffffffffffff528,return_code,(char (*) [37])in_stack_fffffffffffff518,
                 (char **)in_stack_fffffffffffff510);
    }
  }
  local_778._40_8_ = &local_6b0;
  local_740 = &local_748;
  local_778[0x27] = 1;
  local_748 = (KTXTexture2 *)local_778._40_8_;
  std::__cxx11::string::string((string *)local_778);
  std::__cxx11::string::string(local_798);
  executeDeflate()::$_0::operator()[abi_cxx11_(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
  std::__cxx11::string::operator=((string *)local_778,local_7b8);
  std::__cxx11::string::~string(local_7b8);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    executeDeflate()::$_0::operator()[abi_cxx11_
              (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0);
    __f = (flag_type)((ulong)in_stack_fffffffffffff4e0 >> 0x20);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff4f0,
                 (char *)in_stack_fffffffffffff4e8,__f);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)in_stack_fffffffffffff4b0);
      in_stack_fffffffffffff54f =
           std::
           regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff4c0,
                      (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                      in_stack_fffffffffffff4b8,
                      (match_flag_type)((ulong)in_stack_fffffffffffff4b0 >> 0x20));
      if ((bool)in_stack_fffffffffffff54f) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff4b0
                   ,(char *)in_stack_fffffffffffff4a8);
        std::
        regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff4c0
                   ,(match_flag_type)((ulong)in_stack_fffffffffffff4b8 >> 0x20));
      }
      else {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff4b0
                   ,(char *)in_stack_fffffffffffff4a8);
        in_stack_fffffffffffff54e =
             std::
             regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff4c0,
                        (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                        in_stack_fffffffffffff4b8,
                        (match_flag_type)((ulong)in_stack_fffffffffffff4b0 >> 0x20));
        if ((bool)in_stack_fffffffffffff54e) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     in_stack_fffffffffffff4b0,(char *)in_stack_fffffffffffff4a8);
          std::
          regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     in_stack_fffffffffffff4c0,
                     (match_flag_type)((ulong)in_stack_fffffffffffff4b8 >> 0x20));
        }
        in_stack_fffffffffffff540 = (Reporter *)0x0;
        std::__cxx11::string::find_first_of((char)local_7d8,0x20);
        std::__cxx11::string::substr((ulong)local_838,(ulong)local_7d8);
        std::__cxx11::string::operator=(local_798,local_838);
        std::__cxx11::string::~string(local_838);
      }
      local_83c = 0;
      while( true ) {
        uVar6 = (ulong)local_83c;
        sVar7 = std::__cxx11::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff4b0);
        if (sVar7 <= uVar6) break;
        uVar6 = std::__cxx11::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)in_stack_fffffffffffff4c0,(size_type)in_stack_fffffffffffff4b8);
        pcVar8 = (char *)std::__cxx11::
                         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)in_stack_fffffffffffff4b0,(size_type)in_stack_fffffffffffff4a8)
        ;
        std::__cxx11::string::replace((ulong)local_778,uVar6,pcVar8);
        local_83c = local_83c + 1;
      }
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) != 0) {
          local_778[0x27] = 0;
        }
      }
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0x2571c7);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff4b0);
    }
    std::__cxx11::string::~string(local_7d8);
  }
  if ((local_778[0x27] & 1) != 0) {
    local_230 = &local_870;
    local_238 = "{} {}";
    local_110 = "{} {}";
    local_870 = "{} {}";
    psVar12 = &local_868;
    local_108 = local_230;
    sVar9 = std::char_traits<char>::length((char_type *)0x25727c);
    *psVar12 = sVar9;
    local_60 = local_238;
    lVar10 = in_RDI + 8;
    version_abi_cxx11_(SUB81((ulong)in_stack_fffffffffffff4d8 >> 0x38,0));
    local_240 = local_860;
    local_250 = local_870;
    sStack_248 = local_868;
    local_260 = &local_8b0._destructed;
    local_80 = &local_250;
    local_270 = local_870;
    local_258 = lVar10;
    local_78 = local_270;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffff4d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff4d0);
    local_a8 = &local_280;
    local_b0 = local_2a8;
    local_98 = 0xdd;
    local_280 = 0xdd;
    fmt.size_ = in_stack_fffffffffffff730;
    fmt.data_ = in_stack_fffffffffffff728;
    local_a0 = local_b0;
    local_90 = local_a8;
    local_88 = local_b0;
    local_278 = local_b0;
    ::fmt::v10::vformat_abi_cxx11_(fmt,in_stack_fffffffffffff718);
    std::__cxx11::string::~string((string *)&local_8b0._destructed);
    executeDeflate::anon_class_8_1_2ed807fb::operator()
              ((anon_class_8_1_2ed807fb *)in_stack_fffffffffffff4d0,
               (char *)in_stack_fffffffffffff4c8,(string *)in_stack_fffffffffffff4c0);
    std::__cxx11::string::~string(local_860);
  }
  local_1d0 = &local_8c0;
  auStack_1e8._16_8_ = "{}";
  local_120 = "{}";
  local_8c0 = "{}";
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8b8;
  local_118 = local_1d0;
  sVar9 = std::char_traits<char>::length((char_type *)0x257516);
  *(size_t *)args = sVar9;
  local_58 = (char *)auStack_1e8._16_8_;
  local_1f8 = in_RDI + 0x50;
  auStack_1e8._8_8_ = local_8b8 + 8;
  local_1f0 = local_8c0;
  auStack_1e8._0_8_ = local_8b8;
  local_100 = &local_1f0;
  local_208 = local_8c0;
  local_f8 = local_208;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::fmt::v10::
           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                     (in_stack_fffffffffffff4b8);
  local_d8 = &local_218;
  local_e0 = local_228;
  local_c0 = 0xd;
  local_218 = 0xd;
  fmt_00.size_ = in_stack_fffffffffffff730;
  fmt_00.data_ = in_stack_fffffffffffff728;
  args_2 = extraout_RDX;
  local_228[0] = args_1;
  local_d0 = local_e0;
  local_c8 = local_e0;
  local_b8 = local_d8;
  local_210 = local_e0;
  ::fmt::v10::vformat_abi_cxx11_(fmt_00,in_stack_fffffffffffff718);
  this_00 = (path *)std::__cxx11::string::operator[]((ulong)(local_8b8 + 8));
  if ((this_00->_M_pathname)._M_dataplus != (_Alloc_hider)0x20) {
    __assert_fail("newScParams[0] == \' \'",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_deflate.cpp"
                  ,0x123,"void ktx::CommandDeflate::executeDeflate()");
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    if ((local_778[0x27] & 1) == 0) {
      std::__cxx11::string::append((string *)local_778);
    }
    else {
      in_stack_fffffffffffff4d0 =
           (StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)(local_8b8 + 8)
      ;
      sVar9 = std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff4b0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff4a8);
      in_stack_fffffffffffff4d8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::erase(in_stack_fffffffffffff4d0,local_8c8);
      local_138 = &local_908;
      local_140 = "{} / (from {}) {}";
      local_130 = "{} / (from {}) {}";
      local_908 = "{} / (from {}) {}";
      in_stack_fffffffffffff4c0 =
           (StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)&local_900;
      pbVar13 = in_stack_fffffffffffff4d8;
      local_128 = local_138;
      in_stack_fffffffffffff4c8 =
           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)std::char_traits<char>::length((char_type *)0x2577df);
      *(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        **)&in_stack_fffffffffffff4c0->_vptr_StreambufStream = in_stack_fffffffffffff4c8;
      local_8 = local_140;
      local_148 = local_8f8;
      local_158 = local_908;
      pp_Stack_150 = local_900;
      local_160 = local_8b8 + 8;
      local_168 = local_798;
      local_170 = local_778;
      local_50 = &local_158;
      local_180 = local_908;
      local_48 = local_180;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (args,args_1,args_2);
      local_30 = &local_190;
      local_38 = local_1c8;
      local_20 = 0xddd;
      local_190 = 0xddd;
      fmt_01.size_ = sVar9;
      fmt_01.data_ = (char *)pbVar13;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      local_188 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(fmt_01,in_stack_fffffffffffff718);
      std::__cxx11::string::operator=((string *)local_778,local_8f8);
      std::__cxx11::string::~string(local_8f8);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)local_778,(string *)(local_8b8 + 8));
    in_stack_fffffffffffff4b0 = (InputStream *)local_778;
    local_918 = std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff4b0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff4a8);
    local_920 = std::__cxx11::string::erase(in_stack_fffffffffffff4b0,local_910);
  }
  executeDeflate::anon_class_8_1_2ed807fb::operator()
            ((anon_class_8_1_2ed807fb *)in_stack_fffffffffffff4d0,(char *)in_stack_fffffffffffff4c8,
             (string *)in_stack_fffffffffffff4c0);
  fVar11 = (format)((ulong)in_stack_fffffffffffff4d0 >> 0x38);
  std::__cxx11::string::string(local_988,(string *)(in_RDI + 0xa0));
  DecodeUTF8Path(in_stack_fffffffffffff4a8);
  std::filesystem::__cxx11::path::path(this_00,in_stack_fffffffffffff4d8,fVar11);
  std::__cxx11::string::~string(local_968);
  std::__cxx11::string::~string(local_988);
  uVar6 = std::filesystem::__cxx11::path::has_parent_path();
  if ((uVar6 & 1) != 0) {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::create_directories(&local_9b0);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff4b0);
  }
  OutputStream::OutputStream
            ((OutputStream *)in_stack_fffffffffffff550,
             (string *)
             CONCAT17(in_stack_fffffffffffff54f,
                      CONCAT16(in_stack_fffffffffffff54e,in_stack_fffffffffffff548)),
             in_stack_fffffffffffff540);
  KTXTexture2::operator_cast_to_ktxTexture_(&local_6b0);
  OutputStream::writeKTX2
            ((OutputStream *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  OutputStream::~OutputStream((OutputStream *)in_stack_fffffffffffff4b0);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff4b0);
  std::__cxx11::string::~string((string *)(local_8b8 + 8));
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string((string *)local_778);
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
            (in_stack_fffffffffffff4c0);
  KTXTexture2::~KTXTexture2((KTXTexture2 *)in_stack_fffffffffffff4b0);
  InputStream::~InputStream(in_stack_fffffffffffff4b0);
  return;
}

Assistant:

void CommandDeflate::executeDeflate() {
    InputStream inputStream(options.inputFilepath, *this);
    validateToolInput(inputStream, fmtInFile(options.inputFilepath), *this);

    KTXTexture2 texture{nullptr};
    StreambufStream<std::streambuf*> ktx2Stream{inputStream->rdbuf(), std::ios::in | std::ios::binary};
    auto ret = ktxTexture2_CreateFromStream(ktx2Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    if (ret != KTX_SUCCESS)
        fatal(rc::INVALID_FILE, "Failed to create KTX2 texture: {}", ktxErrorString(ret));

    if (texture->supercompressionScheme != KTX_SS_NONE) {
        switch (texture->supercompressionScheme) {
          case KTX_SS_ZLIB:
          case KTX_SS_ZSTD:
            if (!options.quiet) {
                warning("Modifying existing {} supercompression of {}.",
                        toString(texture->supercompressionScheme),
                        options.inputFilepath);
            }
            break;
          default:
            fatal(rc::INVALID_FILE,
                  "Cannot further deflate a KTX2 file supercompressed with {}.",
                  toString(texture->supercompressionScheme));
        }
    }

    if (options.zstd) {
        ret = ktxTexture2_DeflateZstd(texture, *options.zstd);
        if (ret != KTX_SUCCESS)
            fatal(rc::IO_FAILURE, "Zstd deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    if (options.zlib) {
        ret = ktxTexture2_DeflateZLIB(texture, *options.zlib);
        if (ret != KTX_SUCCESS)
            fatal(rc::IO_FAILURE, "ZLIB deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    const auto& findMetadataValue = [&](const char* const key) {
        const char* value;
        uint32_t valueLen;
        std::string result;
        auto ret = ktxHashList_FindValue(&texture->kvDataHead, key,
                      &valueLen, (void**)&value);
        if (ret == KTX_SUCCESS) {
            // The values we are looking for are required to be NUL terminated.
            result.assign(value, valueLen - 1);
        }
        return result;
    };

    const auto updateMetadataValue = [&](const char* const key,
                                 const std::string& value) {
        ktxHashList_DeleteKVPair(&texture->kvDataHead, key);
        ktxHashList_AddKVPair(&texture->kvDataHead, key,
                static_cast<uint32_t>(value.size() + 1), // +1 to include \0
                value.c_str());
    };

    // ======= KTXwriter and KTXwriterScParams metadata handling =======
    //
    // In order to preserve encoding parameters applied to the data with
    // other apps prior to this deflate operation, `deflate` does the
    // following if KTXwriterScParams data exists in the input file:
    //
    // 1. If the writer was one of the ktx suite (i.e. create or encode)
    //    and KTXwriterScParams contains non-deflate options, use the
    //    original KTXwriter. Replace an existing deflate option with
    //    that currently specified or append it as new.
    //
    //    The original writer will obviously understand its own
    //    non-deflate options and, since it is part of the ktx suite
    //    it will understand the updated or new deflate option that will
    //    be added.
    //
    //    Cheeky! Spec. for KTXwriter says "only the most recent writer
    //    Should be identified." For KTXwriterScParams it says the writer
    //    should "append the (new) options" when "building on operations
    //    done previously." To somewhat resolve the conflict it changes
    //    the previous "only" to "in general."
    //
    // 2. If the writer was another tool, preserve its options in
    //    KTWwriterScParams labelled with its name and append the
    //    currently specified deflate option like so
    //
    //        --zstd 18 | (from <name>) option1 option2 ...
    //
    //    where <name> is the first word of the original KTXwriter metadata,
    //    e.g, "tokt". Rewrite KTXwriter with the name of this tool.
    //
    // 3. If the writer was ktxsc or toktx remove any original deflate
    //    option from the preserved parameters as we know those option
    //    names.

    bool changeWriter = true;
    std::string writerScParams;
    std::string origWriterName;
    writerScParams = findMetadataValue(KTX_WRITER_SCPARAMS_KEY);
    if (!writerScParams.empty()) {
        std::string writer = findMetadataValue(KTX_WRITER_KEY);
        if (!writer.empty()) {
            std::regex e("ktx (?:create|deflate|encode|transcode)");
            std::smatch deflateOptionMatch;
            if (std::regex_search(writer, e)) {
                // Writer is member of the ktx suite.
                // Look for existing deflate option
                e = " ?--(?:zlib|zstd) [1-9][0-9]?";
                (void)std::regex_search(writerScParams, deflateOptionMatch, e);
            } else {
                // Writer is not a member of the ktx suite
                e = "ktxsc|toktx";
                if (std::regex_search(writer, e)) {
                    // Look for toktx/ktxsc deflate option
                    e = " ?--zcmp ?[1-9]?[0-9]?";
                    (void)std::regex_search(writerScParams,
                                            deflateOptionMatch, e);
                }
                origWriterName = writer.substr(0, writer.find_first_of(' '));
            }
            // Remove existing deflate option since its value will not apply
            // to the newly deflated data.
            for (uint32_t i = 0; i < deflateOptionMatch.size(); i++) {
                 writerScParams.replace(deflateOptionMatch.position(i),
                                        deflateOptionMatch.length(i),
                                        "");
            }
            // Does ScParams still have data and is the original writer a
            // member of the ktx suite?
            if (!writerScParams.empty() && origWriterName.empty()) {
                changeWriter = false;
            }
        }
    }

    if (changeWriter) {
        // Create or modify KTXwriter metadata.
        const auto writer = fmt::format("{} {}", commandName, version(options.testrun));
        updateMetadataValue(KTX_WRITER_KEY, writer);
    }

    // Format new writerScParams.
    auto newScParams = fmt::format("{}", options.compressOptions);
    // Options always contain a leading space
    assert(newScParams[0] == ' ');
    if (!writerScParams.empty()) {
        if (changeWriter) {
            // Leading space unneeded as this param will be first.
            newScParams.erase(newScParams.begin());
            writerScParams = fmt::format("{} / (from {}) {}", newScParams,
                                         origWriterName, writerScParams);
        } else {
            writerScParams.append(newScParams);
        }
    } else {
        writerScParams = newScParams;
        writerScParams.erase(writerScParams.begin()); // Erase leading space.
    }

    // Add KTXwriterScParams metadata
    updateMetadataValue(KTX_WRITER_SCPARAMS_KEY, writerScParams);

    // Save output file
    const auto outputPath = std::filesystem::path(DecodeUTF8Path(options.outputFilepath));
    if (outputPath.has_parent_path())
        std::filesystem::create_directories(outputPath.parent_path());

    OutputStream outputFile(options.outputFilepath, *this);
    outputFile.writeKTX2(texture, *this);
}